

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O1

void aom_quantize_b_32x32_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  int *piVar1;
  tran_low_t *ptVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  char cVar7;
  bool bVar8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  bool bVar30;
  undefined1 auVar31 [14];
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [12];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  unkbyte10 Var49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [14];
  undefined1 auVar52 [12];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [12];
  undefined1 auVar57 [14];
  undefined1 auVar58 [12];
  unkbyte10 Var59;
  ulong uVar60;
  long lVar61;
  uint uVar62;
  uint16_t uVar63;
  short *psVar64;
  ulong uVar65;
  bool bVar66;
  short sVar69;
  int iVar67;
  int iVar70;
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar78 [12];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  ushort uVar92;
  ushort uVar117;
  ushort uVar119;
  ushort uVar121;
  ushort uVar123;
  short sVar125;
  short sVar126;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  short sVar124;
  short sVar127;
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar128 [16];
  ushort uVar132;
  ushort uVar133;
  ushort uVar134;
  ushort uVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar136;
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  ushort uVar146;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  ushort uVar152;
  ushort uVar153;
  ushort uVar154;
  undefined1 auVar147 [16];
  ushort uVar155;
  undefined1 auVar148 [16];
  undefined1 auVar156 [12];
  ushort uVar163;
  ushort uVar164;
  ushort uVar165;
  ushort uVar166;
  ushort uVar167;
  ushort uVar168;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  ushort uVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  ushort uVar175;
  undefined1 auVar174 [16];
  undefined1 auVar176 [12];
  ushort uVar182;
  undefined1 auVar177 [16];
  ushort uVar181;
  ushort uVar183;
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  ushort uVar184;
  ushort uVar190;
  ushort uVar191;
  ushort uVar192;
  ushort uVar193;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  ushort uVar194;
  undefined1 auVar195 [12];
  ushort uVar200;
  ushort uVar201;
  ushort uVar202;
  ushort uVar203;
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 auVar82 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  short sVar89;
  short sVar90;
  short sVar91;
  undefined8 uVar93;
  undefined1 auVar97 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar98 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar99 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  short sVar118;
  short sVar120;
  short sVar122;
  undefined1 auVar137 [12];
  undefined1 auVar138 [16];
  undefined1 auVar160 [16];
  undefined1 auVar179 [16];
  undefined8 uVar185;
  undefined1 auVar186 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  
  auVar71 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar68 = ZEXT416(*(uint *)zbin_ptr) & _DAT_00515640;
  sVar69 = auVar68._2_2_ + auVar71._2_2_;
  auVar45._4_8_ =
       (long)(((unkuint10)
               (uint6)(((unkuint10)CONCAT22(auVar71._6_2_,auVar71._6_2_) << 0x30) >> 0x20) << 0x20)
             >> 0x10);
  auVar45._2_2_ = sVar69;
  auVar45._0_2_ = sVar69;
  iVar67 = (int)(short)(auVar68._0_2_ + auVar71._0_2_);
  iVar70 = auVar45._0_4_ >> 0x10;
  local_70 = CONCAT44(iVar70,iVar67);
  auVar68 = pshuflw(ZEXT416(*(uint *)dequant_ptr),ZEXT416(*(uint *)dequant_ptr),0xd4);
  auVar68 = pmaddwd(auVar68,_DAT_00514960);
  auVar128._8_4_ = 0xffffffff;
  auVar128._0_8_ = 0xffffffffffffffff;
  auVar128._12_4_ = 0xffffffff;
  iVar70 = iVar70 * 0x20 + -1 + (auVar68._4_4_ + 0x40 >> 7);
  uVar132 = (ushort)(zbin_ptr[4] + 1U) >> 1;
  uVar133 = (ushort)(zbin_ptr[5] + 1U) >> 1;
  uVar134 = (ushort)(zbin_ptr[6] + 1U) >> 1;
  uVar135 = (ushort)(zbin_ptr[7] + 1U) >> 1;
  sVar73 = uVar132 - 1;
  sVar74 = uVar133 - 1;
  sVar75 = uVar134 - 1;
  sVar76 = uVar135 - 1;
  auVar157 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar170 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc))
  ;
  sVar89 = auVar157._0_2_;
  sVar69 = -sVar89;
  sVar90 = auVar157._2_2_;
  sVar72 = -sVar90;
  sVar91 = auVar157._4_2_;
  sVar77 = -sVar91;
  sVar118 = auVar157._6_2_;
  sVar144 = -sVar118;
  sVar120 = auVar157._8_2_;
  sVar3 = -sVar120;
  sVar122 = auVar157._10_2_;
  sVar4 = -sVar122;
  sVar124 = auVar157._12_2_;
  sVar5 = -sVar124;
  sVar125 = auVar157._14_2_;
  sVar6 = -sVar125;
  uVar92 = (ushort)(sVar69 < sVar89) * sVar89 | (ushort)(sVar69 >= sVar89) * sVar69;
  uVar117 = (ushort)(sVar72 < sVar90) * sVar90 | (ushort)(sVar72 >= sVar90) * sVar72;
  uVar119 = (ushort)(sVar77 < sVar91) * sVar91 | (ushort)(sVar77 >= sVar91) * sVar77;
  uVar121 = (ushort)(sVar144 < sVar118) * sVar118 | (ushort)(sVar144 >= sVar118) * sVar144;
  uVar93 = CONCAT26(uVar121,CONCAT24(uVar119,CONCAT22(uVar117,uVar92)));
  uVar123 = (ushort)(sVar3 < sVar120) * sVar120 | (ushort)(sVar3 >= sVar120) * sVar3;
  auVar204._0_10_ = CONCAT28(uVar123,uVar93);
  auVar204._10_2_ = (ushort)(sVar4 < sVar122) * sVar122 | (ushort)(sVar4 >= sVar122) * sVar4;
  auVar204._12_2_ = (ushort)(sVar5 < sVar124) * sVar124 | (ushort)(sVar5 >= sVar124) * sVar5;
  auVar204._14_2_ = (ushort)(sVar6 < sVar125) * sVar125 | (ushort)(sVar6 >= sVar125) * sVar6;
  sVar89 = auVar170._0_2_;
  sVar69 = -sVar89;
  sVar90 = auVar170._2_2_;
  sVar72 = -sVar90;
  sVar91 = auVar170._4_2_;
  sVar77 = -sVar91;
  sVar118 = auVar170._6_2_;
  sVar144 = -sVar118;
  sVar120 = auVar170._8_2_;
  sVar3 = -sVar120;
  sVar122 = auVar170._10_2_;
  sVar4 = -sVar122;
  sVar124 = auVar170._12_2_;
  sVar5 = -sVar124;
  sVar125 = auVar170._14_2_;
  sVar6 = -sVar125;
  uVar184 = (ushort)(sVar69 < sVar89) * sVar89 | (ushort)(sVar69 >= sVar89) * sVar69;
  uVar190 = (ushort)(sVar72 < sVar90) * sVar90 | (ushort)(sVar72 >= sVar90) * sVar72;
  uVar191 = (ushort)(sVar77 < sVar91) * sVar91 | (ushort)(sVar77 >= sVar91) * sVar77;
  uVar192 = (ushort)(sVar144 < sVar118) * sVar118 | (ushort)(sVar144 >= sVar118) * sVar144;
  uVar185 = CONCAT26(uVar192,CONCAT24(uVar191,CONCAT22(uVar190,uVar184)));
  uVar193 = (ushort)(sVar3 < sVar120) * sVar120 | (ushort)(sVar3 >= sVar120) * sVar3;
  auVar186._0_10_ = CONCAT28(uVar193,uVar185);
  auVar186._10_2_ = (ushort)(sVar4 < sVar122) * sVar122 | (ushort)(sVar4 >= sVar122) * sVar4;
  auVar186._12_2_ = (ushort)(sVar5 < sVar124) * sVar124 | (ushort)(sVar5 >= sVar124) * sVar5;
  auVar186._14_2_ = (ushort)(sVar6 < sVar125) * sVar125 | (ushort)(sVar6 >= sVar125) * sVar6;
  auVar14._10_2_ = 0;
  auVar14._0_10_ = auVar204._0_10_;
  auVar14._12_2_ = uVar121;
  auVar22._8_2_ = uVar119;
  auVar22._0_8_ = uVar93;
  auVar22._10_4_ = auVar14._10_4_;
  auVar46._6_8_ = 0;
  auVar46._0_6_ = auVar22._8_6_;
  auVar29._4_2_ = uVar117;
  auVar29._0_4_ = CONCAT22(uVar117,uVar92);
  auVar29._6_8_ = SUB148(auVar46 << 0x40,6);
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar186._0_10_;
  auVar9._12_2_ = uVar192;
  auVar15._8_2_ = uVar191;
  auVar15._0_8_ = uVar185;
  auVar15._10_4_ = auVar9._10_4_;
  auVar47._6_8_ = 0;
  auVar47._0_6_ = auVar15._8_6_;
  auVar25._4_2_ = uVar190;
  auVar25._0_4_ = CONCAT22(uVar190,uVar184);
  auVar25._6_8_ = SUB148(auVar47 << 0x40,6);
  auVar68._0_4_ =
       -(uint)(iVar67 * 0x20 + -1 + (auVar68._0_4_ + 0x40 >> 7) < (int)((uint)uVar92 << 5));
  auVar68._4_4_ = -(uint)(iVar70 < auVar29._4_4_ << 5);
  auVar68._8_4_ = -(uint)(iVar70 < auVar22._8_4_ << 5);
  auVar68._12_4_ = -(uint)(iVar70 < (int)((auVar14._10_4_ >> 0x10) << 5));
  auVar71._0_4_ = -(uint)(iVar70 < (int)((uint)uVar123 << 5));
  auVar71._4_4_ = -(uint)(iVar70 < (int)((uint)auVar204._10_2_ << 5));
  auVar71._8_4_ = -(uint)(iVar70 < (int)((uint)auVar204._12_2_ << 5));
  auVar71._12_4_ = -(uint)(iVar70 < (int)((uint)auVar204._14_2_ << 5));
  auVar71 = packssdw(auVar68,auVar71);
  auVar147._0_4_ = -(uint)(iVar70 < (int)((uint)uVar184 << 5));
  auVar147._4_4_ = -(uint)(iVar70 < auVar25._4_4_ << 5);
  auVar147._8_4_ = -(uint)(iVar70 < auVar15._8_4_ << 5);
  auVar147._12_4_ = -(uint)(iVar70 < (int)((auVar9._10_4_ >> 0x10) << 5));
  auVar158._0_4_ = -(uint)(iVar70 < (int)((uint)uVar193 << 5));
  auVar158._4_4_ = -(uint)(iVar70 < (int)((uint)auVar186._10_2_ << 5));
  auVar158._8_4_ = -(uint)(iVar70 < (int)((uint)auVar186._12_2_ << 5));
  auVar158._12_4_ = -(uint)(iVar70 < (int)((uint)auVar186._14_2_ << 5));
  auVar147 = packssdw(auVar147,auVar158);
  auVar68 = auVar147 | auVar71;
  uVar146 = 0;
  uVar149 = 0;
  uVar150 = 0;
  uVar151 = 0;
  uVar152 = 0;
  uVar153 = 0;
  uVar154 = 0;
  uVar155 = 0;
  bVar43 = (auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar44 = (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar42 = (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar41 = (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar40 = (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar39 = (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar36 = (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar35 = (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar34 = (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar32 = (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar30 = (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar8 = (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar66 = auVar68[0xf] < '\0';
  if (((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
             bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8) ||
      bVar66) {
    auVar71 = auVar71 & *(undefined1 (*) [16])iscan;
    auVar147 = auVar147 & *(undefined1 (*) [16])(iscan + 8);
    sVar69 = auVar71._0_2_;
    sVar72 = auVar147._0_2_;
    uVar146 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._2_2_;
    sVar72 = auVar147._2_2_;
    uVar149 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._4_2_;
    sVar72 = auVar147._4_2_;
    uVar150 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._6_2_;
    sVar72 = auVar147._6_2_;
    uVar151 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._8_2_;
    sVar72 = auVar147._8_2_;
    uVar152 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._10_2_;
    sVar72 = auVar147._10_2_;
    uVar153 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._12_2_;
    sVar72 = auVar147._12_2_;
    sVar77 = auVar147._14_2_;
    uVar154 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar71._14_2_;
    uVar155 = (ushort)(sVar77 < sVar69) * sVar69 | (ushort)(sVar77 >= sVar69) * sVar77;
  }
  bVar66 = ((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
                  bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8
           ) || bVar66;
  auVar129._0_2_ = -(ushort)((short)uVar92 < (short)((ushort)(*zbin_ptr + 1U) >> 1));
  auVar129._2_2_ = -(ushort)((short)uVar117 < (short)((ushort)(zbin_ptr[1] + 1U) >> 1));
  auVar129._4_2_ = -(ushort)((short)uVar119 < (short)((ushort)(zbin_ptr[2] + 1U) >> 1));
  auVar129._6_2_ = -(ushort)((short)uVar121 < (short)((ushort)(zbin_ptr[3] + 1U) >> 1));
  auVar129._8_2_ = -(ushort)((short)uVar123 < (short)uVar132);
  auVar129._10_2_ = -(ushort)((short)auVar204._10_2_ < (short)uVar133);
  auVar129._12_2_ = -(ushort)((short)auVar204._12_2_ < (short)uVar134);
  auVar129._14_2_ = -(ushort)((short)auVar204._14_2_ < (short)uVar135);
  auVar177._0_2_ = -(ushort)(sVar73 < (short)uVar184);
  auVar177._2_2_ = -(ushort)(sVar74 < (short)uVar190);
  auVar177._4_2_ = -(ushort)(sVar75 < (short)uVar191);
  auVar177._6_2_ = -(ushort)(sVar76 < (short)uVar192);
  auVar177._8_2_ = -(ushort)(sVar73 < (short)uVar193);
  auVar177._10_2_ = -(ushort)(sVar74 < (short)auVar186._10_2_);
  auVar177._12_2_ = -(ushort)(sVar75 < (short)auVar186._12_2_);
  auVar177._14_2_ = -(ushort)(sVar76 < (short)auVar186._14_2_);
  auVar68 = auVar177 | auVar128 ^ auVar129;
  cVar7 = auVar68[0xf];
  uVar117 = 0;
  uVar119 = 0;
  uVar134 = 0;
  uVar92 = 0;
  uVar133 = 0;
  uVar132 = 0;
  uVar123 = 0;
  uVar121 = 0;
  bVar43 = (auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar44 = (auVar68 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar42 = (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar41 = (auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar40 = (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar39 = (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar68 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar36 = (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar35 = (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar34 = (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar32 = (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar30 = (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar8 = (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  if (((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
             bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8) ||
      cVar7 < '\0') {
    auVar128 = (auVar128 ^ auVar129) & *(undefined1 (*) [16])iscan;
    auVar71 = *(undefined1 (*) [16])(iscan + 8) & auVar177;
    sVar69 = auVar128._0_2_;
    sVar72 = auVar71._0_2_;
    uVar117 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._2_2_;
    sVar72 = auVar71._2_2_;
    uVar119 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._4_2_;
    sVar72 = auVar71._4_2_;
    uVar134 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._6_2_;
    sVar72 = auVar71._6_2_;
    uVar92 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._8_2_;
    sVar72 = auVar71._8_2_;
    uVar133 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._10_2_;
    sVar72 = auVar71._10_2_;
    uVar132 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._12_2_;
    sVar72 = auVar71._12_2_;
    sVar77 = auVar71._14_2_;
    uVar123 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
    sVar69 = auVar128._14_2_;
    uVar121 = (ushort)(sVar77 < sVar69) * sVar69 | (ushort)(sVar77 >= sVar69) * sVar77;
  }
  bVar8 = ((((((((((((((bVar43 || bVar44) || bVar42) || bVar41) || bVar40) || bVar39) || bVar38) ||
                 bVar37) || bVar36) || bVar35) || bVar34) || bVar33) || bVar32) || bVar30) || bVar8)
          || cVar7 < '\0';
  auVar71 = *(undefined1 (*) [16])quant_ptr;
  auVar128 = *(undefined1 (*) [16])dequant_ptr;
  auVar147 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar78._0_2_ = (ushort)(*round_ptr + 1U) >> 1;
  auVar78._2_2_ = (ushort)(round_ptr[1] + 1U) >> 1;
  auVar78._4_2_ = (ushort)(round_ptr[2] + 1U) >> 1;
  auVar78._6_2_ = (ushort)(round_ptr[3] + 1U) >> 1;
  auVar78._8_2_ = (ushort)(round_ptr[4] + 1U) >> 1;
  auVar78._10_2_ = (ushort)(round_ptr[5] + 1U) >> 1;
  auVar79._12_2_ = (ushort)(round_ptr[6] + 1U) >> 1;
  auVar79._0_12_ = auVar78;
  auVar79._14_2_ = (ushort)(round_ptr[7] + 1U) >> 1;
  local_38._8_4_ = auVar78._8_4_;
  local_38._12_4_ = auVar79._12_4_;
  local_48._0_8_ = auVar71._8_8_;
  local_58._0_8_ = auVar147._8_8_;
  local_68._0_8_ = auVar128._8_8_;
  if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar68 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar68 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar68 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar68 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar68 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar68 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar68 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar68 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < cVar7) {
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    local_38._4_4_ = local_38._12_4_;
    local_38._0_4_ = local_38._8_4_;
    local_48._8_4_ = auVar71._8_4_;
    local_48._12_4_ = auVar71._12_4_;
    local_58._8_4_ = auVar147._8_4_;
    local_58._12_4_ = auVar147._12_4_;
    local_68._8_4_ = auVar128._8_4_;
    local_68._12_4_ = auVar128._12_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
  }
  else {
    auVar158 = psraw(auVar157,0xf);
    auVar171 = psraw(auVar170,0xf);
    auVar68 = paddsw(auVar204,auVar79);
    auVar204 = pmulhw(auVar68,auVar71);
    auVar205._0_2_ = auVar204._0_2_ + auVar68._0_2_;
    auVar205._2_2_ = auVar204._2_2_ + auVar68._2_2_;
    auVar205._4_2_ = auVar204._4_2_ + auVar68._4_2_;
    auVar205._6_2_ = auVar204._6_2_ + auVar68._6_2_;
    auVar205._8_2_ = auVar204._8_2_ + auVar68._8_2_;
    auVar205._10_2_ = auVar204._10_2_ + auVar68._10_2_;
    auVar205._12_2_ = auVar204._12_2_ + auVar68._12_2_;
    auVar205._14_2_ = auVar204._14_2_ + auVar68._14_2_;
    sVar69 = auVar147._8_2_;
    sVar72 = auVar147._10_2_;
    sVar77 = auVar147._12_2_;
    sVar144 = auVar147._14_2_;
    auVar68 = pmulhw(auVar205,auVar147);
    auVar94._0_2_ = (ushort)(auVar205._0_2_ * auVar147._0_2_) >> 0xf;
    auVar94._2_2_ = (ushort)(auVar205._2_2_ * auVar147._2_2_) >> 0xf;
    auVar94._4_2_ = (ushort)(auVar205._4_2_ * auVar147._4_2_) >> 0xf;
    auVar94._6_2_ = (ushort)(auVar205._6_2_ * auVar147._6_2_) >> 0xf;
    auVar94._8_2_ = (ushort)(auVar205._8_2_ * sVar69) >> 0xf;
    auVar94._10_2_ = (ushort)(auVar205._10_2_ * sVar72) >> 0xf;
    auVar94._12_2_ = (ushort)(auVar205._12_2_ * sVar77) >> 0xf;
    auVar94._14_2_ = (ushort)(auVar205._14_2_ * sVar144) >> 0xf;
    auVar206._2_2_ = auVar68._2_2_ * 2;
    auVar206._0_2_ = auVar68._0_2_ * 2;
    auVar206._4_2_ = auVar68._4_2_ * 2;
    auVar206._6_2_ = auVar68._6_2_ * 2;
    auVar206._8_2_ = auVar68._8_2_ * 2;
    auVar206._10_2_ = auVar68._10_2_ * 2;
    auVar206._12_2_ = auVar68._12_2_ * 2;
    auVar206._14_2_ = auVar68._14_2_ * 2;
    local_38._4_4_ = local_38._12_4_;
    local_38._0_4_ = local_38._8_4_;
    local_48._8_4_ = auVar71._8_4_;
    local_48._12_4_ = auVar71._12_4_;
    local_58._8_4_ = auVar147._8_4_;
    local_58._12_4_ = auVar147._12_4_;
    auVar71 = paddsw(auVar186,local_38);
    auVar68 = pmulhw(auVar71,local_48);
    auVar157._0_2_ = auVar68._0_2_ + auVar71._0_2_;
    auVar157._2_2_ = auVar68._2_2_ + auVar71._2_2_;
    auVar157._4_2_ = auVar68._4_2_ + auVar71._4_2_;
    auVar157._6_2_ = auVar68._6_2_ + auVar71._6_2_;
    auVar157._8_2_ = auVar68._8_2_ + auVar71._8_2_;
    auVar157._10_2_ = auVar68._10_2_ + auVar71._10_2_;
    auVar157._12_2_ = auVar68._12_2_ + auVar71._12_2_;
    auVar157._14_2_ = auVar68._14_2_ + auVar71._14_2_;
    auVar68 = pmulhw(auVar157,local_58);
    auVar95._0_2_ = (ushort)(auVar157._0_2_ * sVar69) >> 0xf;
    auVar95._2_2_ = (ushort)(auVar157._2_2_ * sVar72) >> 0xf;
    auVar95._4_2_ = (ushort)(auVar157._4_2_ * sVar77) >> 0xf;
    auVar95._6_2_ = (ushort)(auVar157._6_2_ * sVar144) >> 0xf;
    auVar95._8_2_ = (ushort)(auVar157._8_2_ * sVar69) >> 0xf;
    auVar95._10_2_ = (ushort)(auVar157._10_2_ * sVar72) >> 0xf;
    auVar95._12_2_ = (ushort)(auVar157._12_2_ * sVar77) >> 0xf;
    auVar95._14_2_ = (ushort)(auVar157._14_2_ * sVar144) >> 0xf;
    auVar170._2_2_ = auVar68._2_2_ * 2;
    auVar170._0_2_ = auVar68._0_2_ * 2;
    auVar170._4_2_ = auVar68._4_2_ * 2;
    auVar170._6_2_ = auVar68._6_2_ * 2;
    auVar170._8_2_ = auVar68._8_2_ * 2;
    auVar170._10_2_ = auVar68._10_2_ * 2;
    auVar170._12_2_ = auVar68._12_2_ * 2;
    auVar170._14_2_ = auVar68._14_2_ * 2;
    auVar68 = (auVar206 | auVar94) ^ auVar158;
    auVar130._0_2_ = auVar68._0_2_ - auVar158._0_2_;
    auVar130._2_2_ = auVar68._2_2_ - auVar158._2_2_;
    auVar130._4_2_ = auVar68._4_2_ - auVar158._4_2_;
    auVar130._6_2_ = auVar68._6_2_ - auVar158._6_2_;
    auVar130._8_2_ = auVar68._8_2_ - auVar158._8_2_;
    auVar130._10_2_ = auVar68._10_2_ - auVar158._10_2_;
    auVar130._12_2_ = auVar68._12_2_ - auVar158._12_2_;
    auVar130._14_2_ = auVar68._14_2_ - auVar158._14_2_;
    auVar68 = (auVar170 | auVar95) ^ auVar171;
    auVar80._0_2_ = auVar68._0_2_ - auVar171._0_2_;
    auVar80._2_2_ = auVar68._2_2_ - auVar171._2_2_;
    auVar80._4_2_ = auVar68._4_2_ - auVar171._4_2_;
    auVar80._6_2_ = auVar68._6_2_ - auVar171._6_2_;
    auVar80._8_2_ = auVar68._8_2_ - auVar171._8_2_;
    auVar80._10_2_ = auVar68._10_2_ - auVar171._10_2_;
    auVar80._12_2_ = auVar68._12_2_ - auVar171._12_2_;
    auVar80._14_2_ = auVar68._14_2_ - auVar171._14_2_;
    auVar130 = ~auVar129 & auVar130;
    auVar177 = auVar177 & auVar80;
    auVar71 = psraw(auVar130,0xf);
    sVar91 = auVar130._6_2_;
    auVar83._0_12_ = auVar130._0_12_;
    auVar83._12_2_ = sVar91;
    auVar83._14_2_ = auVar71._6_2_;
    auVar82._12_4_ = auVar83._12_4_;
    auVar82._0_10_ = auVar130._0_10_;
    auVar82._10_2_ = auVar71._4_2_;
    sVar90 = auVar130._4_2_;
    auVar171._10_6_ = auVar82._10_6_;
    auVar171._0_8_ = auVar130._0_8_;
    auVar171._8_2_ = sVar90;
    auVar81._8_8_ = auVar171._8_8_;
    auVar81._6_2_ = auVar71._2_2_;
    sVar89 = auVar130._2_2_;
    auVar81._4_2_ = sVar89;
    auVar81._0_2_ = auVar130._0_2_;
    auVar81._2_2_ = auVar71._0_2_;
    sVar124 = auVar130._8_2_;
    sVar125 = auVar130._10_2_;
    uVar191 = auVar71._10_2_;
    sVar126 = auVar130._12_2_;
    uVar192 = auVar71._12_2_;
    sVar127 = auVar130._14_2_;
    uVar193 = auVar71._14_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar81;
    *(short *)(qcoeff_ptr + 4) = sVar124;
    *(ushort *)((long)qcoeff_ptr + 0x12) = auVar71._8_2_;
    *(short *)(qcoeff_ptr + 5) = sVar125;
    *(ushort *)((long)qcoeff_ptr + 0x16) = uVar191;
    *(short *)(qcoeff_ptr + 6) = sVar126;
    *(ushort *)((long)qcoeff_ptr + 0x1a) = uVar192;
    *(short *)(qcoeff_ptr + 7) = sVar127;
    *(ushort *)((long)qcoeff_ptr + 0x1e) = uVar193;
    auVar68 = psraw(auVar177,0xf);
    sVar122 = auVar177._6_2_;
    auVar99._0_12_ = auVar177._0_12_;
    auVar99._12_2_ = sVar122;
    auVar99._14_2_ = auVar68._6_2_;
    auVar98._12_4_ = auVar99._12_4_;
    auVar98._0_10_ = auVar177._0_10_;
    auVar98._10_2_ = auVar68._4_2_;
    sVar120 = auVar177._4_2_;
    auVar97._10_6_ = auVar98._10_6_;
    auVar97._0_8_ = auVar177._0_8_;
    auVar97._8_2_ = sVar120;
    auVar96._8_8_ = auVar97._8_8_;
    auVar96._6_2_ = auVar68._2_2_;
    sVar118 = auVar177._2_2_;
    auVar96._4_2_ = sVar118;
    auVar96._0_2_ = auVar177._0_2_;
    auVar96._2_2_ = auVar68._0_2_;
    sVar141 = auVar177._8_2_;
    sVar142 = auVar177._10_2_;
    uVar135 = auVar68._10_2_;
    sVar143 = auVar177._12_2_;
    uVar184 = auVar68._12_2_;
    sVar145 = auVar177._14_2_;
    uVar190 = auVar68._14_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar96;
    *(short *)(qcoeff_ptr + 0xc) = sVar141;
    *(ushort *)((long)qcoeff_ptr + 0x32) = auVar68._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = sVar142;
    *(ushort *)((long)qcoeff_ptr + 0x36) = uVar135;
    *(short *)(qcoeff_ptr + 0xe) = sVar143;
    *(ushort *)((long)qcoeff_ptr + 0x3a) = uVar184;
    *(short *)(qcoeff_ptr + 0xf) = sVar145;
    *(ushort *)((long)qcoeff_ptr + 0x3e) = uVar190;
    sVar69 = -auVar81._0_2_;
    sVar72 = -sVar89;
    sVar77 = -sVar90;
    sVar144 = -sVar91;
    sVar3 = -sVar124;
    sVar4 = -sVar125;
    sVar5 = -sVar126;
    sVar6 = -sVar127;
    auVar100._0_2_ =
         (ushort)(sVar69 < auVar81._0_2_) * auVar81._0_2_ |
         (ushort)(sVar69 >= auVar81._0_2_) * sVar69;
    auVar100._2_2_ = (ushort)(sVar72 < sVar89) * sVar89 | (ushort)(sVar72 >= sVar89) * sVar72;
    auVar100._4_2_ = (ushort)(sVar77 < sVar90) * sVar90 | (ushort)(sVar77 >= sVar90) * sVar77;
    auVar100._6_2_ = (ushort)(sVar144 < sVar91) * sVar91 | (ushort)(sVar144 >= sVar91) * sVar144;
    auVar100._8_2_ = (ushort)(sVar3 < sVar124) * sVar124 | (ushort)(sVar3 >= sVar124) * sVar3;
    auVar100._10_2_ = (ushort)(sVar4 < sVar125) * sVar125 | (ushort)(sVar4 >= sVar125) * sVar4;
    auVar100._12_2_ = (ushort)(sVar5 < sVar126) * sVar126 | (ushort)(sVar5 >= sVar126) * sVar5;
    auVar100._14_2_ = (ushort)(sVar6 < sVar127) * sVar127 | (ushort)(sVar6 >= sVar127) * sVar6;
    auVar16._10_2_ = 0;
    auVar16._0_10_ = auVar71._0_10_;
    auVar16._12_2_ = auVar71._6_2_;
    auVar23._8_2_ = auVar71._4_2_;
    auVar23._0_8_ = auVar71._0_8_;
    auVar23._10_4_ = auVar16._10_4_;
    auVar48._6_8_ = 0;
    auVar48._0_6_ = auVar23._8_6_;
    Var49 = CONCAT82(SUB148(auVar48 << 0x40,6),auVar71._2_2_);
    auVar131._0_4_ = CONCAT22(0,auVar71._0_2_);
    auVar131._4_10_ = Var49;
    auVar131._14_2_ = 0;
    auVar159._0_4_ = CONCAT22(0,auVar71._8_2_);
    auVar159._4_2_ = uVar191;
    auVar159._6_2_ = 0;
    auVar159._8_2_ = uVar192;
    auVar159._10_2_ = 0;
    auVar159._12_2_ = uVar193;
    auVar159._14_2_ = 0;
    sVar69 = auVar100._6_2_ * auVar128._6_2_;
    sVar89 = auVar128._8_2_;
    sVar90 = auVar128._10_2_;
    sVar91 = auVar128._12_2_;
    sVar124 = auVar128._14_2_;
    auVar71 = pmulhw(auVar100,auVar128);
    uVar62 = CONCAT22(auVar71._6_2_,sVar69);
    Var59 = CONCAT64(CONCAT42(uVar62,auVar71._4_2_),CONCAT22(auVar100._4_2_ * auVar128._4_2_,sVar69)
                    );
    auVar50._4_8_ = (long)((unkuint10)Var59 >> 0x10);
    auVar50._2_2_ = auVar71._2_2_;
    auVar50._0_2_ = auVar100._2_2_ * auVar128._2_2_;
    uVar136 = CONCAT22(auVar71._8_2_,auVar100._8_2_ * sVar89);
    auVar137._0_8_ = CONCAT26(auVar71._10_2_,CONCAT24(auVar100._10_2_ * sVar90,uVar136));
    auVar137._8_2_ = auVar100._12_2_ * sVar91;
    auVar137._10_2_ = auVar71._12_2_;
    auVar138._12_2_ = auVar100._14_2_ * sVar124;
    auVar138._0_12_ = auVar137;
    auVar138._14_2_ = auVar71._14_2_;
    auVar172._0_4_ = CONCAT22(auVar71._0_2_,auVar100._0_2_ * auVar128._0_2_) >> 1;
    auVar172._4_4_ = auVar50._0_4_ >> 1;
    auVar172._8_4_ = (uint)((unkuint10)Var59 >> 0x10) >> 1;
    auVar172._12_4_ = uVar62 >> 1;
    auVar139._0_4_ = uVar136 >> 1;
    auVar139._4_4_ = (uint)((ulong)auVar137._0_8_ >> 0x21);
    auVar139._8_4_ = auVar137._8_4_ >> 1;
    auVar139._12_4_ = auVar138._12_4_ >> 1;
    auVar172 = auVar172 ^ auVar131;
    auVar139 = auVar139 ^ auVar159;
    *dqcoeff_ptr = auVar172._0_4_ - auVar131._0_4_;
    dqcoeff_ptr[1] = auVar172._4_4_ - (int)Var49;
    dqcoeff_ptr[2] = auVar172._8_4_ - auVar23._8_4_;
    dqcoeff_ptr[3] = auVar172._12_4_ - (auVar16._10_4_ >> 0x10);
    dqcoeff_ptr[4] = auVar139._0_4_ - auVar159._0_4_;
    dqcoeff_ptr[5] = auVar139._4_4_ - (uint)uVar191;
    dqcoeff_ptr[6] = auVar139._8_4_ - (uint)uVar192;
    dqcoeff_ptr[7] = auVar139._12_4_ - (uint)uVar193;
    local_68._8_4_ = auVar128._8_4_;
    local_68._12_4_ = auVar128._12_4_;
    sVar69 = -auVar96._0_2_;
    sVar72 = -sVar118;
    sVar77 = -sVar120;
    sVar144 = -sVar122;
    sVar3 = -sVar141;
    sVar4 = -sVar142;
    sVar5 = -sVar143;
    sVar6 = -sVar145;
    auVar101._0_2_ =
         (ushort)(sVar69 < auVar96._0_2_) * auVar96._0_2_ |
         (ushort)(sVar69 >= auVar96._0_2_) * sVar69;
    auVar101._2_2_ = (ushort)(sVar72 < sVar118) * sVar118 | (ushort)(sVar72 >= sVar118) * sVar72;
    auVar101._4_2_ = (ushort)(sVar77 < sVar120) * sVar120 | (ushort)(sVar77 >= sVar120) * sVar77;
    auVar101._6_2_ = (ushort)(sVar144 < sVar122) * sVar122 | (ushort)(sVar144 >= sVar122) * sVar144;
    auVar101._8_2_ = (ushort)(sVar3 < sVar141) * sVar141 | (ushort)(sVar3 >= sVar141) * sVar3;
    auVar101._10_2_ = (ushort)(sVar4 < sVar142) * sVar142 | (ushort)(sVar4 >= sVar142) * sVar4;
    auVar101._12_2_ = (ushort)(sVar5 < sVar143) * sVar143 | (ushort)(sVar5 >= sVar143) * sVar5;
    auVar101._14_2_ = (ushort)(sVar6 < sVar145) * sVar145 | (ushort)(sVar6 >= sVar145) * sVar6;
    auVar10._10_2_ = 0;
    auVar10._0_10_ = auVar68._0_10_;
    auVar10._12_2_ = auVar68._6_2_;
    auVar17._8_2_ = auVar68._4_2_;
    auVar17._0_8_ = auVar68._0_8_;
    auVar17._10_4_ = auVar10._10_4_;
    auVar51._6_8_ = 0;
    auVar51._0_6_ = auVar17._8_6_;
    auVar26._4_2_ = auVar68._2_2_;
    auVar26._0_4_ = auVar68._0_4_;
    auVar26._6_8_ = SUB148(auVar51 << 0x40,6);
    auVar140._0_4_ = auVar68._0_4_ & 0xffff;
    auVar140._4_10_ = auVar26._4_10_;
    auVar140._14_2_ = 0;
    auVar84._0_4_ = CONCAT22(0,auVar68._8_2_);
    auVar84._4_2_ = uVar135;
    auVar84._6_2_ = 0;
    auVar84._8_2_ = uVar184;
    auVar84._10_2_ = 0;
    auVar84._12_2_ = uVar190;
    auVar84._14_2_ = 0;
    auVar68 = pmulhw(auVar101,local_68);
    uVar62 = CONCAT22(auVar68._6_2_,auVar101._6_2_ * sVar124);
    Var49 = CONCAT64(CONCAT42(uVar62,auVar68._4_2_),
                     CONCAT22(auVar101._4_2_ * sVar91,auVar101._6_2_ * sVar124));
    auVar52._4_8_ = (long)((unkuint10)Var49 >> 0x10);
    auVar52._2_2_ = auVar68._2_2_;
    auVar52._0_2_ = auVar101._2_2_ * sVar90;
    uVar136 = CONCAT22(auVar68._8_2_,auVar101._8_2_ * sVar89);
    auVar156._0_8_ = CONCAT26(auVar68._10_2_,CONCAT24(auVar101._10_2_ * sVar90,uVar136));
    auVar156._8_2_ = auVar101._12_2_ * sVar91;
    auVar156._10_2_ = auVar68._12_2_;
    auVar160._12_2_ = auVar101._14_2_ * sVar124;
    auVar160._0_12_ = auVar156;
    auVar160._14_2_ = auVar68._14_2_;
    auVar173._0_4_ = CONCAT22(auVar68._0_2_,auVar101._0_2_ * sVar89) >> 1;
    auVar173._4_4_ = auVar52._0_4_ >> 1;
    auVar173._8_4_ = (uint)((unkuint10)Var49 >> 0x10) >> 1;
    auVar173._12_4_ = uVar62 >> 1;
    auVar161._0_4_ = uVar136 >> 1;
    auVar161._4_4_ = (uint)((ulong)auVar156._0_8_ >> 0x21);
    auVar161._8_4_ = auVar156._8_4_ >> 1;
    auVar161._12_4_ = auVar160._12_4_ >> 1;
    auVar173 = auVar173 ^ auVar140;
    auVar161 = auVar161 ^ auVar84;
    dqcoeff_ptr[8] = auVar173._0_4_ - auVar140._0_4_;
    dqcoeff_ptr[9] = auVar173._4_4_ - auVar26._4_4_;
    dqcoeff_ptr[10] = auVar173._8_4_ - auVar17._8_4_;
    dqcoeff_ptr[0xb] = auVar173._12_4_ - (auVar10._10_4_ >> 0x10);
    dqcoeff_ptr[0xc] = auVar161._0_4_ - auVar84._0_4_;
    dqcoeff_ptr[0xd] = auVar161._4_4_ - (uint)uVar135;
    dqcoeff_ptr[0xe] = auVar161._8_4_ - (uint)uVar184;
    dqcoeff_ptr[0xf] = auVar161._12_4_ - (uint)uVar190;
  }
  uVar146 = (-1 < (short)uVar146) * uVar146;
  uVar149 = (-1 < (short)uVar149) * uVar149;
  uVar150 = (-1 < (short)uVar150) * uVar150;
  uVar151 = (-1 < (short)uVar151) * uVar151;
  uVar152 = (-1 < (short)uVar152) * uVar152;
  uVar153 = (-1 < (short)uVar153) * uVar153;
  uVar154 = (-1 < (short)uVar154) * uVar154;
  uVar155 = (-1 < (short)uVar155) * uVar155;
  uVar117 = (-1 < (short)uVar117) * uVar117;
  uVar119 = (-1 < (short)uVar119) * uVar119;
  uVar134 = (-1 < (short)uVar134) * uVar134;
  uVar92 = (-1 < (short)uVar92) * uVar92;
  uVar133 = (-1 < (short)uVar133) * uVar133;
  uVar132 = (-1 < (short)uVar132) * uVar132;
  uVar123 = (-1 < (short)uVar123) * uVar123;
  uVar121 = (-1 < (short)uVar121) * uVar121;
  if (0x10 < n_coeffs) {
    lVar61 = 0x10;
    do {
      auVar128 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar61),
                          *(undefined1 (*) [16])(coeff_ptr + lVar61 + 4));
      auVar147 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar61 + 8),
                          *(undefined1 (*) [16])(coeff_ptr + lVar61 + 0xc));
      sVar89 = auVar128._0_2_;
      sVar69 = -sVar89;
      sVar90 = auVar128._2_2_;
      sVar72 = -sVar90;
      sVar91 = auVar128._4_2_;
      sVar77 = -sVar91;
      sVar118 = auVar128._6_2_;
      sVar144 = -sVar118;
      sVar120 = auVar128._8_2_;
      sVar3 = -sVar120;
      sVar122 = auVar128._10_2_;
      sVar4 = -sVar122;
      sVar124 = auVar128._12_2_;
      sVar5 = -sVar124;
      sVar125 = auVar128._14_2_;
      sVar6 = -sVar125;
      uVar135 = (ushort)(sVar69 < sVar89) * sVar89 | (ushort)(sVar69 >= sVar89) * sVar69;
      uVar184 = (ushort)(sVar72 < sVar90) * sVar90 | (ushort)(sVar72 >= sVar90) * sVar72;
      uVar190 = (ushort)(sVar77 < sVar91) * sVar91 | (ushort)(sVar77 >= sVar91) * sVar77;
      uVar191 = (ushort)(sVar144 < sVar118) * sVar118 | (ushort)(sVar144 >= sVar118) * sVar144;
      uVar93 = CONCAT26(uVar191,CONCAT24(uVar190,CONCAT22(uVar184,uVar135)));
      uVar192 = (ushort)(sVar3 < sVar120) * sVar120 | (ushort)(sVar3 >= sVar120) * sVar3;
      auVar102._0_10_ = CONCAT28(uVar192,uVar93);
      auVar102._10_2_ = (ushort)(sVar4 < sVar122) * sVar122 | (ushort)(sVar4 >= sVar122) * sVar4;
      auVar102._12_2_ = (ushort)(sVar5 < sVar124) * sVar124 | (ushort)(sVar5 >= sVar124) * sVar5;
      auVar102._14_2_ = (ushort)(sVar6 < sVar125) * sVar125 | (ushort)(sVar6 >= sVar125) * sVar6;
      sVar89 = auVar147._0_2_;
      sVar69 = -sVar89;
      sVar90 = auVar147._2_2_;
      sVar72 = -sVar90;
      sVar91 = auVar147._4_2_;
      sVar77 = -sVar91;
      sVar118 = auVar147._6_2_;
      sVar144 = -sVar118;
      sVar120 = auVar147._8_2_;
      sVar3 = -sVar120;
      sVar122 = auVar147._10_2_;
      sVar4 = -sVar122;
      sVar124 = auVar147._12_2_;
      sVar5 = -sVar124;
      sVar125 = auVar147._14_2_;
      sVar6 = -sVar125;
      uVar194 = (ushort)(sVar69 < sVar89) * sVar89 | (ushort)(sVar69 >= sVar89) * sVar69;
      uVar200 = (ushort)(sVar72 < sVar90) * sVar90 | (ushort)(sVar72 >= sVar90) * sVar72;
      uVar201 = (ushort)(sVar77 < sVar91) * sVar91 | (ushort)(sVar77 >= sVar91) * sVar77;
      uVar202 = (ushort)(sVar144 < sVar118) * sVar118 | (ushort)(sVar144 >= sVar118) * sVar144;
      uVar185 = CONCAT26(uVar202,CONCAT24(uVar201,CONCAT22(uVar200,uVar194)));
      uVar203 = (ushort)(sVar3 < sVar120) * sVar120 | (ushort)(sVar3 >= sVar120) * sVar3;
      auVar196._0_10_ = CONCAT28(uVar203,uVar185);
      auVar196._10_2_ = (ushort)(sVar4 < sVar122) * sVar122 | (ushort)(sVar4 >= sVar122) * sVar4;
      auVar196._12_2_ = (ushort)(sVar5 < sVar124) * sVar124 | (ushort)(sVar5 >= sVar124) * sVar5;
      auVar196._14_2_ = (ushort)(sVar6 < sVar125) * sVar125 | (ushort)(sVar6 >= sVar125) * sVar6;
      auVar18._10_2_ = 0;
      auVar18._0_10_ = auVar102._0_10_;
      auVar18._12_2_ = uVar191;
      auVar24._8_2_ = uVar190;
      auVar24._0_8_ = uVar93;
      auVar24._10_4_ = auVar18._10_4_;
      auVar53._6_8_ = 0;
      auVar53._0_6_ = auVar24._8_6_;
      auVar31._4_2_ = uVar184;
      auVar31._0_4_ = CONCAT22(uVar184,uVar135);
      auVar31._6_8_ = SUB148(auVar53 << 0x40,6);
      auVar11._10_2_ = 0;
      auVar11._0_10_ = auVar196._0_10_;
      auVar11._12_2_ = uVar202;
      auVar19._8_2_ = uVar201;
      auVar19._0_8_ = uVar185;
      auVar19._10_4_ = auVar11._10_4_;
      auVar54._6_8_ = 0;
      auVar54._0_6_ = auVar19._8_6_;
      auVar27._4_2_ = uVar200;
      auVar27._0_4_ = CONCAT22(uVar200,uVar194);
      auVar27._6_8_ = SUB148(auVar54 << 0x40,6);
      auVar85._0_4_ = -(uint)(iVar70 < (int)((uint)uVar135 << 5));
      auVar85._4_4_ = -(uint)(iVar70 < auVar31._4_4_ << 5);
      auVar85._8_4_ = -(uint)(iVar70 < auVar24._8_4_ << 5);
      auVar85._12_4_ = -(uint)(iVar70 < (int)((auVar18._10_4_ >> 0x10) << 5));
      auVar148._0_4_ = -(uint)(iVar70 < (int)((uint)uVar192 << 5));
      auVar148._4_4_ = -(uint)(iVar70 < (int)((uint)auVar102._10_2_ << 5));
      auVar148._8_4_ = -(uint)(iVar70 < (int)((uint)auVar102._12_2_ << 5));
      auVar148._12_4_ = -(uint)(iVar70 < (int)((uint)auVar102._14_2_ << 5));
      auVar68 = packssdw(auVar85,auVar148);
      auVar162._0_4_ = -(uint)(iVar70 < (int)((uint)uVar194 << 5));
      auVar162._4_4_ = -(uint)(iVar70 < auVar27._4_4_ << 5);
      auVar162._8_4_ = -(uint)(iVar70 < auVar19._8_4_ << 5);
      auVar162._12_4_ = -(uint)(iVar70 < (int)((auVar11._10_4_ >> 0x10) << 5));
      auVar187._0_4_ = -(uint)(iVar70 < (int)((uint)uVar203 << 5));
      auVar187._4_4_ = -(uint)(iVar70 < (int)((uint)auVar196._10_2_ << 5));
      auVar187._8_4_ = -(uint)(iVar70 < (int)((uint)auVar196._12_2_ << 5));
      auVar187._12_4_ = -(uint)(iVar70 < (int)((uint)auVar196._14_2_ << 5));
      auVar204 = packssdw(auVar162,auVar187);
      auVar71 = auVar204 | auVar68;
      uVar193 = 0;
      uVar163 = 0;
      uVar164 = 0;
      uVar165 = 0;
      uVar166 = 0;
      uVar167 = 0;
      uVar168 = 0;
      uVar169 = 0;
      if ((((((((((((((((auVar71 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar71 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar71 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar71 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar71 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar71 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar71 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar71 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar71 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar71 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar71 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar71 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar71[0xf] < '\0'
         ) {
        auVar68 = auVar68 & *(undefined1 (*) [16])(iscan + lVar61);
        auVar204 = auVar204 & *(undefined1 (*) [16])(iscan + lVar61 + 8);
        sVar69 = auVar68._0_2_;
        sVar72 = auVar204._0_2_;
        uVar193 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._2_2_;
        sVar72 = auVar204._2_2_;
        uVar163 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._4_2_;
        sVar72 = auVar204._4_2_;
        uVar164 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._6_2_;
        sVar72 = auVar204._6_2_;
        uVar165 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._8_2_;
        sVar72 = auVar204._8_2_;
        uVar166 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._10_2_;
        sVar72 = auVar204._10_2_;
        uVar167 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._12_2_;
        sVar72 = auVar204._12_2_;
        sVar77 = auVar204._14_2_;
        uVar168 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar68._14_2_;
        uVar169 = (ushort)(sVar77 < sVar69) * sVar69 | (ushort)(sVar77 >= sVar69) * sVar77;
        bVar66 = true;
      }
      auVar86._0_2_ = -(ushort)(sVar73 < (short)uVar135);
      auVar86._2_2_ = -(ushort)(sVar74 < (short)uVar184);
      auVar86._4_2_ = -(ushort)(sVar75 < (short)uVar190);
      auVar86._6_2_ = -(ushort)(sVar76 < (short)uVar191);
      auVar86._8_2_ = -(ushort)(sVar73 < (short)uVar192);
      auVar86._10_2_ = -(ushort)(sVar74 < (short)auVar102._10_2_);
      auVar86._12_2_ = -(ushort)(sVar75 < (short)auVar102._12_2_);
      auVar86._14_2_ = -(ushort)(sVar76 < (short)auVar102._14_2_);
      auVar188._0_2_ = -(ushort)(sVar73 < (short)uVar194);
      auVar188._2_2_ = -(ushort)(sVar74 < (short)uVar200);
      auVar188._4_2_ = -(ushort)(sVar75 < (short)uVar201);
      auVar188._6_2_ = -(ushort)(sVar76 < (short)uVar202);
      auVar188._8_2_ = -(ushort)(sVar73 < (short)uVar203);
      auVar188._10_2_ = -(ushort)(sVar74 < (short)auVar196._10_2_);
      auVar188._12_2_ = -(ushort)(sVar75 < (short)auVar196._12_2_);
      auVar188._14_2_ = -(ushort)(sVar76 < (short)auVar196._14_2_);
      auVar68 = auVar188 | auVar86;
      if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar68 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar68 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar68 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar68 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar68 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar68 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar68 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar68 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar68[0xf])
      {
        uVar135 = 0;
        uVar184 = 0;
        uVar190 = 0;
        uVar191 = 0;
        uVar192 = 0;
        uVar194 = 0;
        uVar200 = 0;
        uVar201 = 0;
      }
      else {
        auVar204 = *(undefined1 (*) [16])(iscan + lVar61) & auVar86;
        auVar71 = *(undefined1 (*) [16])(iscan + lVar61 + 8) & auVar188;
        sVar69 = auVar204._0_2_;
        sVar72 = auVar71._0_2_;
        uVar135 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._2_2_;
        sVar72 = auVar71._2_2_;
        uVar184 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._4_2_;
        sVar72 = auVar71._4_2_;
        uVar190 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._6_2_;
        sVar72 = auVar71._6_2_;
        uVar191 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._8_2_;
        sVar72 = auVar71._8_2_;
        uVar192 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._10_2_;
        sVar72 = auVar71._10_2_;
        uVar194 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._12_2_;
        sVar72 = auVar71._12_2_;
        sVar77 = auVar71._14_2_;
        uVar200 = (ushort)(sVar72 < sVar69) * sVar69 | (ushort)(sVar72 >= sVar69) * sVar72;
        sVar69 = auVar204._14_2_;
        uVar201 = (ushort)(sVar77 < sVar69) * sVar69 | (ushort)(sVar77 >= sVar69) * sVar77;
        bVar8 = true;
      }
      if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar68 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar68 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar68 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar68 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar68 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar68 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar68 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar68 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar68 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar68[0xf])
      {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61) = (undefined1  [16])0x0;
      }
      else {
        auVar71 = psraw(auVar128,0xf);
        auVar204 = psraw(auVar147,0xf);
        auVar68 = paddsw(auVar102,local_38);
        auVar128 = pmulhw(auVar68,local_48);
        auVar207._0_2_ = auVar128._0_2_ + auVar68._0_2_;
        auVar207._2_2_ = auVar128._2_2_ + auVar68._2_2_;
        auVar207._4_2_ = auVar128._4_2_ + auVar68._4_2_;
        auVar207._6_2_ = auVar128._6_2_ + auVar68._6_2_;
        auVar207._8_2_ = auVar128._8_2_ + auVar68._8_2_;
        auVar207._10_2_ = auVar128._10_2_ + auVar68._10_2_;
        auVar207._12_2_ = auVar128._12_2_ + auVar68._12_2_;
        auVar207._14_2_ = auVar128._14_2_ + auVar68._14_2_;
        auVar68 = pmulhw(auVar207,local_58);
        auVar103._0_2_ = (ushort)(auVar207._0_2_ * local_58._0_2_) >> 0xf;
        auVar103._2_2_ = (ushort)(auVar207._2_2_ * local_58._2_2_) >> 0xf;
        auVar103._4_2_ = (ushort)(auVar207._4_2_ * local_58._4_2_) >> 0xf;
        auVar103._6_2_ = (ushort)(auVar207._6_2_ * local_58._6_2_) >> 0xf;
        auVar103._8_2_ = (ushort)(auVar207._8_2_ * local_58._8_2_) >> 0xf;
        auVar103._10_2_ = (ushort)(auVar207._10_2_ * local_58._10_2_) >> 0xf;
        auVar103._12_2_ = (ushort)(auVar207._12_2_ * local_58._12_2_) >> 0xf;
        auVar103._14_2_ = (ushort)(auVar207._14_2_ * local_58._14_2_) >> 0xf;
        auVar208._2_2_ = auVar68._2_2_ * 2;
        auVar208._0_2_ = auVar68._0_2_ * 2;
        auVar208._4_2_ = auVar68._4_2_ * 2;
        auVar208._6_2_ = auVar68._6_2_ * 2;
        auVar208._8_2_ = auVar68._8_2_ * 2;
        auVar208._10_2_ = auVar68._10_2_ * 2;
        auVar208._12_2_ = auVar68._12_2_ * 2;
        auVar208._14_2_ = auVar68._14_2_ * 2;
        auVar128 = paddsw(auVar196,local_38);
        auVar68 = pmulhw(auVar128,local_48);
        auVar104._0_2_ = auVar68._0_2_ + auVar128._0_2_;
        auVar104._2_2_ = auVar68._2_2_ + auVar128._2_2_;
        auVar104._4_2_ = auVar68._4_2_ + auVar128._4_2_;
        auVar104._6_2_ = auVar68._6_2_ + auVar128._6_2_;
        auVar104._8_2_ = auVar68._8_2_ + auVar128._8_2_;
        auVar104._10_2_ = auVar68._10_2_ + auVar128._10_2_;
        auVar104._12_2_ = auVar68._12_2_ + auVar128._12_2_;
        auVar104._14_2_ = auVar68._14_2_ + auVar128._14_2_;
        auVar68 = pmulhw(auVar104,local_58);
        auVar197._0_2_ = (ushort)(auVar104._0_2_ * local_58._0_2_) >> 0xf;
        auVar197._2_2_ = (ushort)(auVar104._2_2_ * local_58._2_2_) >> 0xf;
        auVar197._4_2_ = (ushort)(auVar104._4_2_ * local_58._4_2_) >> 0xf;
        auVar197._6_2_ = (ushort)(auVar104._6_2_ * local_58._6_2_) >> 0xf;
        auVar197._8_2_ = (ushort)(auVar104._8_2_ * local_58._8_2_) >> 0xf;
        auVar197._10_2_ = (ushort)(auVar104._10_2_ * local_58._10_2_) >> 0xf;
        auVar197._12_2_ = (ushort)(auVar104._12_2_ * local_58._12_2_) >> 0xf;
        auVar197._14_2_ = (ushort)(auVar104._14_2_ * local_58._14_2_) >> 0xf;
        auVar105._2_2_ = auVar68._2_2_ * 2;
        auVar105._0_2_ = auVar68._0_2_ * 2;
        auVar105._4_2_ = auVar68._4_2_ * 2;
        auVar105._6_2_ = auVar68._6_2_ * 2;
        auVar105._8_2_ = auVar68._8_2_ * 2;
        auVar105._10_2_ = auVar68._10_2_ * 2;
        auVar105._12_2_ = auVar68._12_2_ * 2;
        auVar105._14_2_ = auVar68._14_2_ * 2;
        auVar68 = (auVar208 | auVar103) ^ auVar71;
        auVar209._0_2_ = auVar68._0_2_ - auVar71._0_2_;
        auVar209._2_2_ = auVar68._2_2_ - auVar71._2_2_;
        auVar209._4_2_ = auVar68._4_2_ - auVar71._4_2_;
        auVar209._6_2_ = auVar68._6_2_ - auVar71._6_2_;
        auVar209._8_2_ = auVar68._8_2_ - auVar71._8_2_;
        auVar209._10_2_ = auVar68._10_2_ - auVar71._10_2_;
        auVar209._12_2_ = auVar68._12_2_ - auVar71._12_2_;
        auVar209._14_2_ = auVar68._14_2_ - auVar71._14_2_;
        auVar68 = (auVar105 | auVar197) ^ auVar204;
        auVar106._0_2_ = auVar68._0_2_ - auVar204._0_2_;
        auVar106._2_2_ = auVar68._2_2_ - auVar204._2_2_;
        auVar106._4_2_ = auVar68._4_2_ - auVar204._4_2_;
        auVar106._6_2_ = auVar68._6_2_ - auVar204._6_2_;
        auVar106._8_2_ = auVar68._8_2_ - auVar204._8_2_;
        auVar106._10_2_ = auVar68._10_2_ - auVar204._10_2_;
        auVar106._12_2_ = auVar68._12_2_ - auVar204._12_2_;
        auVar106._14_2_ = auVar68._14_2_ - auVar204._14_2_;
        auVar86 = auVar86 & auVar209;
        auVar188 = auVar188 & auVar106;
        auVar68 = psraw(auVar86,0xf);
        sVar120 = auVar86._6_2_;
        auVar110._0_12_ = auVar86._0_12_;
        auVar110._12_2_ = sVar120;
        auVar110._14_2_ = auVar68._6_2_;
        auVar109._12_4_ = auVar110._12_4_;
        auVar109._0_10_ = auVar86._0_10_;
        auVar109._10_2_ = auVar68._4_2_;
        sVar91 = auVar86._4_2_;
        auVar108._10_6_ = auVar109._10_6_;
        auVar108._0_8_ = auVar86._0_8_;
        auVar108._8_2_ = sVar91;
        auVar107._8_8_ = auVar108._8_8_;
        auVar107._6_2_ = auVar68._2_2_;
        sVar89 = auVar86._2_2_;
        auVar107._4_2_ = sVar89;
        auVar107._0_2_ = auVar86._0_2_;
        auVar107._2_2_ = auVar68._0_2_;
        sVar124 = auVar86._8_2_;
        sVar125 = auVar86._10_2_;
        uVar181 = auVar68._10_2_;
        sVar126 = auVar86._12_2_;
        uVar182 = auVar68._12_2_;
        sVar127 = auVar86._14_2_;
        uVar183 = auVar68._14_2_;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61) = auVar107;
        ptVar2 = qcoeff_ptr + lVar61 + 4;
        *(short *)ptVar2 = sVar124;
        *(ushort *)((long)ptVar2 + 2) = auVar68._8_2_;
        *(short *)(ptVar2 + 1) = sVar125;
        *(ushort *)((long)ptVar2 + 6) = uVar181;
        *(short *)(ptVar2 + 2) = sVar126;
        *(ushort *)((long)ptVar2 + 10) = uVar182;
        *(short *)(ptVar2 + 3) = sVar127;
        *(ushort *)((long)ptVar2 + 0xe) = uVar183;
        auVar71 = psraw(auVar188,0xf);
        sVar122 = auVar188._6_2_;
        auVar114._0_12_ = auVar188._0_12_;
        auVar114._12_2_ = sVar122;
        auVar114._14_2_ = auVar71._6_2_;
        auVar113._12_4_ = auVar114._12_4_;
        auVar113._0_10_ = auVar188._0_10_;
        auVar113._10_2_ = auVar71._4_2_;
        sVar118 = auVar188._4_2_;
        auVar112._10_6_ = auVar113._10_6_;
        auVar112._0_8_ = auVar188._0_8_;
        auVar112._8_2_ = sVar118;
        auVar111._8_8_ = auVar112._8_8_;
        auVar111._6_2_ = auVar71._2_2_;
        sVar90 = auVar188._2_2_;
        auVar111._4_2_ = sVar90;
        auVar111._0_2_ = auVar188._0_2_;
        auVar111._2_2_ = auVar71._0_2_;
        sVar141 = auVar188._8_2_;
        sVar142 = auVar188._10_2_;
        uVar202 = auVar71._10_2_;
        sVar143 = auVar188._12_2_;
        uVar203 = auVar71._12_2_;
        sVar145 = auVar188._14_2_;
        uVar175 = auVar71._14_2_;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 8) = auVar111;
        ptVar2 = qcoeff_ptr + lVar61 + 0xc;
        *(short *)ptVar2 = sVar141;
        *(ushort *)((long)ptVar2 + 2) = auVar71._8_2_;
        *(short *)(ptVar2 + 1) = sVar142;
        *(ushort *)((long)ptVar2 + 6) = uVar202;
        *(short *)(ptVar2 + 2) = sVar143;
        *(ushort *)((long)ptVar2 + 10) = uVar203;
        *(short *)(ptVar2 + 3) = sVar145;
        *(ushort *)((long)ptVar2 + 0xe) = uVar175;
        sVar69 = -auVar107._0_2_;
        sVar72 = -sVar89;
        sVar77 = -sVar91;
        sVar144 = -sVar120;
        sVar3 = -sVar124;
        sVar4 = -sVar125;
        sVar5 = -sVar126;
        sVar6 = -sVar127;
        auVar115._0_2_ =
             (ushort)(sVar69 < auVar107._0_2_) * auVar107._0_2_ |
             (ushort)(sVar69 >= auVar107._0_2_) * sVar69;
        auVar115._2_2_ = (ushort)(sVar72 < sVar89) * sVar89 | (ushort)(sVar72 >= sVar89) * sVar72;
        auVar115._4_2_ = (ushort)(sVar77 < sVar91) * sVar91 | (ushort)(sVar77 >= sVar91) * sVar77;
        auVar115._6_2_ =
             (ushort)(sVar144 < sVar120) * sVar120 | (ushort)(sVar144 >= sVar120) * sVar144;
        auVar115._8_2_ = (ushort)(sVar3 < sVar124) * sVar124 | (ushort)(sVar3 >= sVar124) * sVar3;
        auVar115._10_2_ = (ushort)(sVar4 < sVar125) * sVar125 | (ushort)(sVar4 >= sVar125) * sVar4;
        auVar115._12_2_ = (ushort)(sVar5 < sVar126) * sVar126 | (ushort)(sVar5 >= sVar126) * sVar5;
        auVar115._14_2_ = (ushort)(sVar6 < sVar127) * sVar127 | (ushort)(sVar6 >= sVar127) * sVar6;
        auVar12._10_2_ = 0;
        auVar12._0_10_ = auVar68._0_10_;
        auVar12._12_2_ = auVar68._6_2_;
        auVar20._8_2_ = auVar68._4_2_;
        auVar20._0_8_ = auVar68._0_8_;
        auVar20._10_4_ = auVar12._10_4_;
        auVar55._6_8_ = 0;
        auVar55._0_6_ = auVar20._8_6_;
        Var49 = CONCAT82(SUB148(auVar55 << 0x40,6),auVar68._2_2_);
        auVar87._0_4_ = CONCAT22(0,auVar68._0_2_);
        auVar87._4_10_ = Var49;
        auVar87._14_2_ = 0;
        auVar178._0_4_ = CONCAT22(0,auVar68._8_2_);
        auVar178._4_2_ = uVar181;
        auVar178._6_2_ = 0;
        auVar178._8_2_ = uVar182;
        auVar178._10_2_ = 0;
        auVar178._12_2_ = uVar183;
        auVar178._14_2_ = 0;
        sVar69 = auVar115._6_2_ * local_68._6_2_;
        auVar68 = pmulhw(auVar115,local_68);
        uVar62 = CONCAT22(auVar68._6_2_,sVar69);
        Var59 = CONCAT64(CONCAT42(uVar62,auVar68._4_2_),
                         CONCAT22(auVar115._4_2_ * local_68._4_2_,sVar69));
        auVar56._4_8_ = (long)((unkuint10)Var59 >> 0x10);
        auVar56._2_2_ = auVar68._2_2_;
        auVar56._0_2_ = auVar115._2_2_ * local_68._2_2_;
        uVar136 = CONCAT22(auVar68._8_2_,auVar115._8_2_ * local_68._8_2_);
        auVar195._0_8_ =
             CONCAT26(auVar68._10_2_,CONCAT24(auVar115._10_2_ * local_68._10_2_,uVar136));
        auVar195._8_2_ = auVar115._12_2_ * local_68._12_2_;
        auVar195._10_2_ = auVar68._12_2_;
        auVar198._12_2_ = auVar115._14_2_ * local_68._14_2_;
        auVar198._0_12_ = auVar195;
        auVar198._14_2_ = auVar68._14_2_;
        auVar210._0_4_ = CONCAT22(auVar68._0_2_,auVar115._0_2_ * local_68._0_2_) >> 1;
        auVar210._4_4_ = auVar56._0_4_ >> 1;
        auVar210._8_4_ = (uint)((unkuint10)Var59 >> 0x10) >> 1;
        auVar210._12_4_ = uVar62 >> 1;
        auVar199._0_4_ = uVar136 >> 1;
        auVar199._4_4_ = (uint)((ulong)auVar195._0_8_ >> 0x21);
        auVar199._8_4_ = auVar195._8_4_ >> 1;
        auVar199._12_4_ = auVar198._12_4_ >> 1;
        auVar210 = auVar210 ^ auVar87;
        auVar199 = auVar199 ^ auVar178;
        piVar1 = dqcoeff_ptr + lVar61;
        *piVar1 = auVar210._0_4_ - auVar87._0_4_;
        piVar1[1] = auVar210._4_4_ - (int)Var49;
        piVar1[2] = auVar210._8_4_ - auVar20._8_4_;
        piVar1[3] = auVar210._12_4_ - (auVar12._10_4_ >> 0x10);
        piVar1 = dqcoeff_ptr + lVar61 + 4;
        *piVar1 = auVar199._0_4_ - auVar178._0_4_;
        piVar1[1] = auVar199._4_4_ - (uint)uVar181;
        piVar1[2] = auVar199._8_4_ - (uint)uVar182;
        piVar1[3] = auVar199._12_4_ - (uint)uVar183;
        sVar69 = -auVar111._0_2_;
        sVar72 = -sVar90;
        sVar77 = -sVar118;
        sVar144 = -sVar122;
        sVar3 = -sVar141;
        sVar4 = -sVar142;
        sVar5 = -sVar143;
        sVar6 = -sVar145;
        auVar88._0_2_ =
             (ushort)(sVar69 < auVar111._0_2_) * auVar111._0_2_ |
             (ushort)(sVar69 >= auVar111._0_2_) * sVar69;
        auVar88._2_2_ = (ushort)(sVar72 < sVar90) * sVar90 | (ushort)(sVar72 >= sVar90) * sVar72;
        auVar88._4_2_ = (ushort)(sVar77 < sVar118) * sVar118 | (ushort)(sVar77 >= sVar118) * sVar77;
        auVar88._6_2_ =
             (ushort)(sVar144 < sVar122) * sVar122 | (ushort)(sVar144 >= sVar122) * sVar144;
        auVar88._8_2_ = (ushort)(sVar3 < sVar141) * sVar141 | (ushort)(sVar3 >= sVar141) * sVar3;
        auVar88._10_2_ = (ushort)(sVar4 < sVar142) * sVar142 | (ushort)(sVar4 >= sVar142) * sVar4;
        auVar88._12_2_ = (ushort)(sVar5 < sVar143) * sVar143 | (ushort)(sVar5 >= sVar143) * sVar5;
        auVar88._14_2_ = (ushort)(sVar6 < sVar145) * sVar145 | (ushort)(sVar6 >= sVar145) * sVar6;
        auVar13._10_2_ = 0;
        auVar13._0_10_ = auVar71._0_10_;
        auVar13._12_2_ = auVar71._6_2_;
        auVar21._8_2_ = auVar71._4_2_;
        auVar21._0_8_ = auVar71._0_8_;
        auVar21._10_4_ = auVar13._10_4_;
        auVar57._6_8_ = 0;
        auVar57._0_6_ = auVar21._8_6_;
        auVar28._4_2_ = auVar71._2_2_;
        auVar28._0_4_ = auVar71._0_4_;
        auVar28._6_8_ = SUB148(auVar57 << 0x40,6);
        auVar116._0_4_ = auVar71._0_4_ & 0xffff;
        auVar116._4_10_ = auVar28._4_10_;
        auVar116._14_2_ = 0;
        auVar174._0_4_ = CONCAT22(0,auVar71._8_2_);
        auVar174._4_2_ = uVar202;
        auVar174._6_2_ = 0;
        auVar174._8_2_ = uVar203;
        auVar174._10_2_ = 0;
        auVar174._12_2_ = uVar175;
        auVar174._14_2_ = 0;
        sVar69 = auVar88._6_2_ * local_68._6_2_;
        auVar68 = pmulhw(auVar88,local_68);
        uVar62 = CONCAT22(auVar68._6_2_,sVar69);
        Var49 = CONCAT64(CONCAT42(uVar62,auVar68._4_2_),
                         CONCAT22(auVar88._4_2_ * local_68._4_2_,sVar69));
        auVar58._4_8_ = (long)((unkuint10)Var49 >> 0x10);
        auVar58._2_2_ = auVar68._2_2_;
        auVar58._0_2_ = auVar88._2_2_ * local_68._2_2_;
        uVar136 = CONCAT22(auVar68._8_2_,auVar88._8_2_ * local_68._8_2_);
        auVar176._0_8_ = CONCAT26(auVar68._10_2_,CONCAT24(auVar88._10_2_ * local_68._10_2_,uVar136))
        ;
        auVar176._8_2_ = auVar88._12_2_ * local_68._12_2_;
        auVar176._10_2_ = auVar68._12_2_;
        auVar179._12_2_ = auVar88._14_2_ * local_68._14_2_;
        auVar179._0_12_ = auVar176;
        auVar179._14_2_ = auVar68._14_2_;
        auVar189._0_4_ = CONCAT22(auVar68._0_2_,auVar88._0_2_ * local_68._0_2_) >> 1;
        auVar189._4_4_ = auVar58._0_4_ >> 1;
        auVar189._8_4_ = (uint)((unkuint10)Var49 >> 0x10) >> 1;
        auVar189._12_4_ = uVar62 >> 1;
        auVar180._0_4_ = uVar136 >> 1;
        auVar180._4_4_ = (uint)((ulong)auVar176._0_8_ >> 0x21);
        auVar180._8_4_ = auVar176._8_4_ >> 1;
        auVar180._12_4_ = auVar179._12_4_ >> 1;
        auVar189 = auVar189 ^ auVar116;
        auVar180 = auVar180 ^ auVar174;
        piVar1 = dqcoeff_ptr + lVar61 + 8;
        *piVar1 = auVar189._0_4_ - auVar116._0_4_;
        piVar1[1] = auVar189._4_4_ - auVar28._4_4_;
        piVar1[2] = auVar189._8_4_ - auVar21._8_4_;
        piVar1[3] = auVar189._12_4_ - (auVar13._10_4_ >> 0x10);
        piVar1 = dqcoeff_ptr + lVar61 + 0xc;
        *piVar1 = auVar180._0_4_ - auVar174._0_4_;
        piVar1[1] = auVar180._4_4_ - (uint)uVar202;
        piVar1[2] = auVar180._8_4_ - (uint)uVar203;
        piVar1[3] = auVar180._12_4_ - (uint)uVar175;
      }
      uVar146 = ((short)uVar146 < (short)uVar193) * uVar193 |
                ((short)uVar146 >= (short)uVar193) * uVar146;
      uVar149 = ((short)uVar149 < (short)uVar163) * uVar163 |
                ((short)uVar149 >= (short)uVar163) * uVar149;
      uVar150 = ((short)uVar150 < (short)uVar164) * uVar164 |
                ((short)uVar150 >= (short)uVar164) * uVar150;
      uVar151 = ((short)uVar151 < (short)uVar165) * uVar165 |
                ((short)uVar151 >= (short)uVar165) * uVar151;
      uVar152 = ((short)uVar152 < (short)uVar166) * uVar166 |
                ((short)uVar152 >= (short)uVar166) * uVar152;
      uVar153 = ((short)uVar153 < (short)uVar167) * uVar167 |
                ((short)uVar153 >= (short)uVar167) * uVar153;
      uVar154 = ((short)uVar154 < (short)uVar168) * uVar168 |
                ((short)uVar154 >= (short)uVar168) * uVar154;
      uVar155 = ((short)uVar155 < (short)uVar169) * uVar169 |
                ((short)uVar155 >= (short)uVar169) * uVar155;
      uVar117 = ((short)uVar117 < (short)uVar135) * uVar135 |
                ((short)uVar117 >= (short)uVar135) * uVar117;
      uVar119 = ((short)uVar119 < (short)uVar184) * uVar184 |
                ((short)uVar119 >= (short)uVar184) * uVar119;
      uVar134 = ((short)uVar134 < (short)uVar190) * uVar190 |
                ((short)uVar134 >= (short)uVar190) * uVar134;
      uVar92 = ((short)uVar92 < (short)uVar191) * uVar191 |
               ((short)uVar92 >= (short)uVar191) * uVar92;
      uVar133 = ((short)uVar133 < (short)uVar192) * uVar192 |
                ((short)uVar133 >= (short)uVar192) * uVar133;
      uVar132 = ((short)uVar132 < (short)uVar194) * uVar194 |
                ((short)uVar132 >= (short)uVar194) * uVar132;
      uVar123 = ((short)uVar123 < (short)uVar200) * uVar200 |
                ((short)uVar123 >= (short)uVar200) * uVar123;
      uVar121 = ((short)uVar121 < (short)uVar201) * uVar201 |
                ((short)uVar121 >= (short)uVar201) * uVar121;
      lVar61 = lVar61 + 0x10;
    } while (lVar61 < n_coeffs);
  }
  if (bVar66) {
    uVar146 = ((short)uVar152 < (short)uVar146) * uVar146 |
              ((short)uVar152 >= (short)uVar146) * uVar152;
    uVar149 = ((short)uVar153 < (short)uVar149) * uVar149 |
              ((short)uVar153 >= (short)uVar149) * uVar153;
    uVar154 = ((short)uVar154 < (short)uVar150) * uVar150 |
              ((short)uVar154 >= (short)uVar150) * uVar154;
    uVar155 = ((short)uVar155 < (short)uVar151) * uVar151 |
              ((short)uVar155 >= (short)uVar151) * uVar155;
    uVar146 = ((short)uVar154 < (short)uVar146) * uVar146 |
              ((short)uVar154 >= (short)uVar146) * uVar154;
    uVar149 = ((short)uVar155 < (short)uVar149) * uVar149 |
              ((short)uVar155 >= (short)uVar149) * uVar155;
    uVar62 = (ushort)(((short)uVar149 < (short)uVar146) * uVar146 |
                     ((short)uVar149 >= (short)uVar146) * uVar149) + 1;
  }
  else {
    uVar62 = 0;
  }
  if (bVar8) {
    uVar149 = ((short)uVar133 < (short)uVar117) * uVar117 |
              ((short)uVar133 >= (short)uVar117) * uVar133;
    uVar146 = ((short)uVar132 < (short)uVar119) * uVar119 |
              ((short)uVar132 >= (short)uVar119) * uVar132;
    uVar155 = ((short)uVar123 < (short)uVar134) * uVar134 |
              ((short)uVar123 >= (short)uVar134) * uVar123;
    uVar154 = ((short)uVar121 < (short)uVar92) * uVar92 |
              ((short)uVar121 >= (short)uVar92) * uVar121;
    uVar149 = ((short)uVar155 < (short)uVar149) * uVar149 |
              ((short)uVar155 >= (short)uVar149) * uVar155;
    uVar146 = ((short)uVar154 < (short)uVar146) * uVar146 |
              ((short)uVar154 >= (short)uVar146) * uVar154;
    uVar136 = (uint)(ushort)(((short)uVar146 < (short)uVar149) * uVar149 |
                            ((short)uVar146 >= (short)uVar149) * uVar146);
  }
  else {
    uVar136 = 0xffffffff;
  }
  if ((int)uVar62 <= (int)uVar136) {
    iVar67 = uVar136 + 1;
    psVar64 = scan + uVar136;
    do {
      sVar69 = *psVar64;
      qcoeff_ptr[sVar69] = 0;
      dqcoeff_ptr[sVar69] = 0;
      iVar67 = iVar67 + -1;
      psVar64 = psVar64 + -1;
    } while ((int)uVar62 < iVar67);
  }
  uVar65 = 0xffffffff;
  uVar60 = (ulong)uVar62;
  do {
    iVar67 = (int)uVar65;
    if ((long)uVar60 < 1) break;
    lVar61 = uVar60 - 1;
    uVar60 = uVar60 - 1;
    if (qcoeff_ptr[scan[lVar61]] != 0) {
      uVar65 = uVar60 & 0xffffffff;
    }
    iVar67 = (int)uVar65;
  } while (qcoeff_ptr[scan[lVar61]] == 0);
  uVar63 = (uint16_t)(iVar67 + 1U);
  *eob_ptr = uVar63;
  if (uVar62 == 0) {
    uVar136 = 0xffffffff;
  }
  else {
    lVar61 = 0;
    do {
      uVar136 = (uint)lVar61;
      if (qcoeff_ptr[scan[lVar61]] != 0) break;
      bVar66 = (ulong)uVar62 - 1 != lVar61;
      lVar61 = lVar61 + 1;
      uVar136 = 0xffffffff;
    } while (bVar66);
  }
  if ((uVar63 != 0) && (uVar62 = (iVar67 + 1U & 0xffff) - 1, uVar136 == uVar62)) {
    sVar69 = scan[uVar62];
    if (((qcoeff_ptr[sVar69] == 1) || (qcoeff_ptr[sVar69] == -1)) &&
       (uVar62 = coeff_ptr[sVar69] >> 0x1f,
       (int)((coeff_ptr[sVar69] << 5 ^ uVar62) - uVar62) <
       *(int *)(local_68 + (ulong)(sVar69 != 0) * 4 + -8) * 0x20 +
       (dequant_ptr[sVar69 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar69] = 0;
      dqcoeff_ptr[sVar69] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_32x32_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  const int log_scale = 1;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i log_scale_vec = _mm_set1_epi16(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, log_scale_vec);
  round = _mm_add_epi16(round, log_scale_vec);
  zbin = _mm_srli_epi16(zbin, log_scale);
  round = _mm_srli_epi16(round, log_scale);
  zbin = _mm_sub_epi16(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);
    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}